

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O0

void qemu_guest_random_seed_thread_part2(uint64_t seed)

{
  long *plVar1;
  GRand *pGVar2;
  undefined8 *puVar3;
  uint64_t local_10;
  uint64_t seed_local;
  
  local_10 = seed;
  plVar1 = (long *)__tls_get_addr(&PTR_0179ea98);
  if (*plVar1 == 0) {
    if ((deterministic & 1U) != 0) {
      pGVar2 = g_rand_new_with_seed_array((guint32 *)&local_10,2);
      puVar3 = (undefined8 *)__tls_get_addr(&PTR_0179ea98);
      *puVar3 = pGVar2;
    }
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/guest-random.c"
             ,0x49,"thread_rand == NULL");
}

Assistant:

void qemu_guest_random_seed_thread_part2(uint64_t seed)
{
#ifndef _MSC_VER
    g_assert(thread_rand == NULL);
    if (deterministic) {
        thread_rand =
            g_rand_new_with_seed_array((const guint32 *)&seed,
                                       sizeof(seed) / sizeof(guint32));
    }
#endif
}